

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int x86MOV(uchar *stream,x86Reg dst,x86Reg src)

{
  uchar uVar1;
  byte bVar2;
  bool bVar3;
  
  bVar2 = 8 < (int)dst | (8 < (int)src) << 2;
  bVar3 = bVar2 != 0;
  if (bVar3) {
    *stream = bVar2 | 0x40;
  }
  stream[bVar3] = 0x89;
  uVar1 = encodeRegister(dst,regCode[src]);
  stream[(ulong)bVar3 + 1] = uVar1;
  return bVar3 + 2;
}

Assistant:

int x86MOV(unsigned char *stream, x86Reg dst, x86Reg src)
{
	unsigned char *start = stream;

	stream += encodeRex(stream, false, src, rNONE, dst);
	*stream++ = 0x89;
	*stream++ = encodeRegister(dst, regCode[src]);

	return int(stream - start);
}